

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_is_sharp_missile(object *obj)

{
  object *obj_local;
  
  obj_local._7_1_ = obj->tval == '\x03' || obj->tval == '\x04';
  return obj_local._7_1_;
}

Assistant:

bool tval_is_sharp_missile(const struct object *obj)
{
	switch (obj->tval) {
		case TV_ARROW:
		case TV_BOLT:
			return true;
		default:
			return false;
	}
}